

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertCluster
          (FBXConverter *this,vector<aiBone_*,_std::allocator<aiBone_*>_> *param_1,Cluster *cl,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *index_out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *count_out_indices,
          aiMatrix4x4 *absolute_transform,aiNode *parent,aiNode *root_node)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Model *this_00;
  string *psVar17;
  size_type sVar18;
  Logger *pLVar19;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar20;
  basic_formatter *pbVar21;
  mapped_type *ppaVar22;
  aiBone *this_01;
  aiMatrix4x4 *paVar23;
  size_type sVar24;
  ulong uVar25;
  aiVertexWeight *paVar26;
  reference pvVar27;
  const_reference pvVar28;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>,_bool>
  pVar29;
  aiVertexWeight *local_b10;
  size_type local_a78;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  string local_8f8;
  _Base_ptr local_8d8;
  undefined1 local_8d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>
  local_8c8;
  undefined4 *local_8a0;
  aiVertexWeight *out_weight;
  size_t j;
  size_t cc;
  size_t index_index;
  size_t i;
  size_t c;
  WeightArray *weights;
  size_t no_index_sentinel;
  aiVertexWeight *cursor;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  undefined1 auStack_818 [8];
  aiMatrix4x4 matrix;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  string local_658;
  char *local_638;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  string local_4b8;
  aiBone *local_498;
  aiBone *bone;
  string local_480;
  undefined1 local_45c [8];
  aiString bone_name;
  string deformer_name;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *count_out_indices_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *index_out_indices_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *out_indices_local;
  Cluster *cl_local;
  vector<aiBone_*,_std::allocator<aiBone_*>_> *local_mesh_bones_local;
  FBXConverter *this_local;
  
  if (cl == (Cluster *)0x0) {
    __assert_fail("cl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x63b,
                  "void Assimp::FBX::FBXConverter::ConvertCluster(std::vector<aiBone *> &, const Cluster *, std::vector<size_t> &, std::vector<size_t> &, std::vector<size_t> &, const aiMatrix4x4 &, aiNode *, aiNode *)"
                 );
  }
  this_00 = Cluster::TargetNode(cl);
  psVar17 = FBX::Object::Name_abi_cxx11_(&this_00->super_Object);
  std::__cxx11::string::string((string *)(bone_name.data + 0x3f8),(string *)psVar17);
  FixNodeName(&local_480,this,(string *)(bone_name.data + 0x3f8));
  aiString::aiString((aiString *)local_45c,&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  local_498 = (aiBone *)0x0;
  sVar18 = std::
           map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
           ::count(&this->bone_map,(key_type *)(bone_name.data + 0x3f8));
  if (sVar18 == 0) {
    pLVar19 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[18]>(&local_7d0,(char (*) [18])"created new bone ");
    matrix._56_8_ = aiString::C_Str((aiString *)local_45c);
    pbVar20 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_7d0,(char **)&matrix.d3);
    pbVar20 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(pbVar20,(char (*) [13])". Deformer: ");
    pbVar21 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(pbVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(bone_name.data + 0x3f8));
    Formatter::basic_formatter::operator_cast_to_string(&local_658,pbVar21);
    Logger::debug(pLVar19,&local_658);
    std::__cxx11::string::~string((string *)&local_658);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_7d0);
    this_01 = (aiBone *)operator_new(0x460);
    aiBone::aiBone(this_01);
    local_498 = this_01;
    aiString::operator=((aiString *)this_01,(aiString *)local_45c);
    paVar23 = Cluster::TransformLink(cl);
    fVar13 = paVar23->a1;
    fVar14 = paVar23->a2;
    fVar15 = paVar23->a3;
    fVar16 = paVar23->a4;
    fVar9 = paVar23->b1;
    fVar10 = paVar23->b2;
    fVar11 = paVar23->b3;
    fVar12 = paVar23->b4;
    fVar5 = paVar23->c1;
    fVar6 = paVar23->c2;
    fVar7 = paVar23->c3;
    fVar8 = paVar23->c4;
    fVar2 = paVar23->d2;
    fVar3 = paVar23->d3;
    fVar4 = paVar23->d4;
    (local_498->mOffsetMatrix).d1 = paVar23->d1;
    (local_498->mOffsetMatrix).d2 = fVar2;
    (local_498->mOffsetMatrix).d3 = fVar3;
    (local_498->mOffsetMatrix).d4 = fVar4;
    (local_498->mOffsetMatrix).c1 = fVar5;
    (local_498->mOffsetMatrix).c2 = fVar6;
    (local_498->mOffsetMatrix).c3 = fVar7;
    (local_498->mOffsetMatrix).c4 = fVar8;
    (local_498->mOffsetMatrix).b1 = fVar9;
    (local_498->mOffsetMatrix).b2 = fVar10;
    (local_498->mOffsetMatrix).b3 = fVar11;
    (local_498->mOffsetMatrix).b4 = fVar12;
    (local_498->mOffsetMatrix).a1 = fVar13;
    (local_498->mOffsetMatrix).a2 = fVar14;
    (local_498->mOffsetMatrix).a3 = fVar15;
    (local_498->mOffsetMatrix).a4 = fVar16;
    aiMatrix4x4t<float>::Inverse(&local_498->mOffsetMatrix);
    auStack_818._0_4_ = absolute_transform->a1;
    auStack_818._4_4_ = absolute_transform->a2;
    matrix.a1 = absolute_transform->a3;
    matrix.a2 = absolute_transform->a4;
    matrix.a3 = absolute_transform->b1;
    matrix.a4 = absolute_transform->b2;
    matrix.b1 = absolute_transform->b3;
    matrix.b2 = absolute_transform->b4;
    matrix.b3 = absolute_transform->c1;
    matrix.b4 = absolute_transform->c2;
    matrix.c1 = absolute_transform->c3;
    matrix.c2 = absolute_transform->c4;
    matrix.c3 = absolute_transform->d1;
    matrix.c4 = absolute_transform->d2;
    matrix.d1 = absolute_transform->d3;
    matrix.d2 = absolute_transform->d4;
    aiMatrix4x4t<float>::operator*
              ((aiMatrix4x4t<float> *)&cursor,&local_498->mOffsetMatrix,
               (aiMatrix4x4t<float> *)auStack_818);
    (local_498->mOffsetMatrix).d1 = local_828;
    (local_498->mOffsetMatrix).d2 = fStack_824;
    (local_498->mOffsetMatrix).d3 = fStack_820;
    (local_498->mOffsetMatrix).d4 = fStack_81c;
    (local_498->mOffsetMatrix).c1 = local_838;
    (local_498->mOffsetMatrix).c2 = fStack_834;
    (local_498->mOffsetMatrix).c3 = fStack_830;
    (local_498->mOffsetMatrix).c4 = fStack_82c;
    (local_498->mOffsetMatrix).b1 = local_848;
    (local_498->mOffsetMatrix).b2 = fStack_844;
    (local_498->mOffsetMatrix).b3 = fStack_840;
    (local_498->mOffsetMatrix).b4 = fStack_83c;
    *(aiVertexWeight **)&local_498->mOffsetMatrix = cursor;
    (local_498->mOffsetMatrix).a3 = fStack_850;
    (local_498->mOffsetMatrix).a4 = fStack_84c;
    no_index_sentinel = 0;
    sVar24 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(out_indices);
    local_498->mNumWeights = (uint)sVar24;
    sVar24 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(out_indices);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar24;
    uVar25 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar25 = 0xffffffffffffffff;
    }
    paVar26 = (aiVertexWeight *)operator_new__(uVar25);
    if (sVar24 != 0) {
      local_b10 = paVar26;
      do {
        aiVertexWeight::aiVertexWeight(local_b10);
        local_b10 = local_b10 + 1;
      } while (local_b10 != paVar26 + sVar24);
    }
    local_498->mWeights = paVar26;
    weights = (WeightArray *)0xffffffffffffffff;
    no_index_sentinel = (size_t)paVar26;
    c = (size_t)Cluster::GetWeights(cl);
    i = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(index_out_indices);
    for (index_index = 0; index_index < i; index_index = index_index + 1) {
      pvVar27 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (index_out_indices,index_index);
      cc = *pvVar27;
      if (cc != 0xffffffffffffffff) {
        pvVar27 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (count_out_indices,index_index);
        j = *pvVar27;
        for (out_weight = (aiVertexWeight *)0x0; out_weight < j;
            out_weight = (aiVertexWeight *)((long)&out_weight->mVertexId + 1)) {
          local_8a0 = (undefined4 *)no_index_sentinel;
          no_index_sentinel = no_index_sentinel + 8;
          pvVar27 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (out_indices,(long)&out_weight->mVertexId + cc);
          *local_8a0 = (int)*pvVar27;
          pvVar28 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)c,index_index);
          local_8a0[1] = *pvVar28;
        }
      }
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_aiBone_*&,_true>
              (&local_8c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (bone_name.data + 0x3f8),&local_498);
    pVar29 = std::
             map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
             ::insert(&this->bone_map,&local_8c8);
    local_8d8 = (_Base_ptr)pVar29.first._M_node;
    local_8d0 = pVar29.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>
    ::~pair(&local_8c8);
  }
  else {
    pLVar19 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[28]>(&local_630,(char (*) [28])"retrieved bone from lookup ");
    local_638 = aiString::C_Str((aiString *)local_45c);
    pbVar20 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_630,&local_638);
    pbVar20 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(pbVar20,(char (*) [12])". Deformer:");
    pbVar21 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(pbVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(bone_name.data + 0x3f8));
    Formatter::basic_formatter::operator_cast_to_string(&local_4b8,pbVar21);
    Logger::debug(pLVar19,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_630);
    ppaVar22 = std::
               map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
               ::operator[](&this->bone_map,(key_type *)(bone_name.data + 0x3f8));
    local_498 = *ppaVar22;
  }
  pLVar19 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[31]>(&local_a70,(char (*) [31])"bone research: Indicies size: ");
  local_a78 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(out_indices);
  pbVar21 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_a70,&local_a78);
  Formatter::basic_formatter::operator_cast_to_string(&local_8f8,pbVar21);
  Logger::debug(pLVar19,&local_8f8);
  std::__cxx11::string::~string((string *)&local_8f8);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_a70);
  std::vector<aiBone_*,_std::allocator<aiBone_*>_>::push_back(param_1,&local_498);
  std::__cxx11::string::~string((string *)(bone_name.data + 0x3f8));
  return;
}

Assistant:

void FBXConverter::ConvertCluster(std::vector<aiBone *> &local_mesh_bones, const Cluster *cl,
                                          std::vector<size_t> &out_indices, std::vector<size_t> &index_out_indices,
                                          std::vector<size_t> &count_out_indices, const aiMatrix4x4 &absolute_transform,
                                          aiNode *parent, aiNode *root_node) {
            ai_assert(cl); // make sure cluster valid
            std::string deformer_name = cl->TargetNode()->Name();
            aiString bone_name = aiString(FixNodeName(deformer_name));

            aiBone *bone = nullptr;

            if (bone_map.count(deformer_name)) {
				ASSIMP_LOG_DEBUG_F("retrieved bone from lookup ", bone_name.C_Str(), ". Deformer:", deformer_name);
				bone = bone_map[deformer_name];
			} else {
				ASSIMP_LOG_DEBUG_F("created new bone ", bone_name.C_Str(), ". Deformer: ", deformer_name);
				bone = new aiBone();
                bone->mName = bone_name;

                // store local transform link for post processing
                bone->mOffsetMatrix = cl->TransformLink();
                bone->mOffsetMatrix.Inverse();

                aiMatrix4x4 matrix = (aiMatrix4x4)absolute_transform;

                bone->mOffsetMatrix = bone->mOffsetMatrix * matrix; // * mesh_offset


                //
                // Now calculate the aiVertexWeights
                //

                aiVertexWeight *cursor = nullptr;

                bone->mNumWeights = static_cast<unsigned int>(out_indices.size());
                cursor = bone->mWeights = new aiVertexWeight[out_indices.size()];

                const size_t no_index_sentinel = std::numeric_limits<size_t>::max();
                const WeightArray& weights = cl->GetWeights();

                const size_t c = index_out_indices.size();
                for (size_t i = 0; i < c; ++i) {
                    const size_t index_index = index_out_indices[i];

                    if (index_index == no_index_sentinel) {
                        continue;
                    }

                    const size_t cc = count_out_indices[i];
                    for (size_t j = 0; j < cc; ++j) {
                        // cursor runs from first element relative to the start
                        // or relative to the start of the next indexes.
                        aiVertexWeight& out_weight = *cursor++;

                        out_weight.mVertexId = static_cast<unsigned int>(out_indices[index_index + j]);
                        out_weight.mWeight = weights[i];
                    }
                }

                bone_map.insert(std::pair<const std::string, aiBone *>(deformer_name, bone));
            }

            ASSIMP_LOG_DEBUG_F("bone research: Indicies size: ", out_indices.size());

            // lookup must be populated in case something goes wrong
            // this also allocates bones to mesh instance outside
            local_mesh_bones.push_back(bone);
        }